

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

archive * archive_read_new(void)

{
  archive_entry *paVar1;
  archive_vtable_conflict *paVar2;
  archive_read *a;
  archive *in_stack_ffffffffffffffe8;
  archive *local_8;
  
  local_8 = (archive *)malloc(0x960);
  if (local_8 == (archive *)0x0) {
    local_8 = (archive *)0x0;
  }
  else {
    memset(local_8,0,0x960);
    local_8->magic = 0xdeb0c5;
    local_8->state = 1;
    paVar1 = archive_entry_new2(in_stack_ffffffffffffffe8);
    *(archive_entry **)(local_8 + 1) = paVar1;
    paVar2 = archive_read_vtable();
    local_8->vtable = paVar2;
  }
  return local_8;
}

Assistant:

struct archive *
archive_read_new(void)
{
	struct archive_read *a;

	a = (struct archive_read *)malloc(sizeof(*a));
	if (a == NULL)
		return (NULL);
	memset(a, 0, sizeof(*a));
	a->archive.magic = ARCHIVE_READ_MAGIC;

	a->archive.state = ARCHIVE_STATE_NEW;
	a->entry = archive_entry_new2(&a->archive);
	a->archive.vtable = archive_read_vtable();

	return (&a->archive);
}